

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O2

void FastPForLib::__pack<20u,false>(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = 0;
  for (lVar3 = 0; (int)lVar3 != 0x14; lVar3 = lVar3 + 1) {
    if (uVar4 == 0) {
      uVar4 = *in;
      in = in + 1;
      out[lVar3] = uVar4;
      uVar4 = 0x14;
    }
    if (uVar4 < 0xd) {
      uVar2 = uVar4 & 0x1f;
      uVar1 = *in;
      in = in + 1;
      uVar4 = uVar4 + 0x14;
      out[lVar3] = out[lVar3] | uVar1 << uVar2;
    }
    uVar1 = 0;
    if (uVar4 < 0x20) {
      out[lVar3] = out[lVar3] | *in << (uVar4 & 0x1f);
      uVar1 = *in;
      in = in + 1;
      out[lVar3 + 1] = uVar1 >> ((byte)-(char)uVar4 & 0x1f);
      uVar1 = uVar4 - 0xc;
    }
    uVar4 = uVar1;
  }
  return;
}

Assistant:

void __pack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are reading
  // k iterates over the output
  for (uint32_t k = 0; k < bit; ++k, ++out) {
    if (inwordpointer == 0) {
      *out = __bitmask<bit, mask>(*in++);
      inwordpointer += bit;
    }
    // compiler (gcc 4.6.3) had trouble with this, cannot unroll
    // while(inwordpointer <= 32-bit) {
    //    *out |= __bitmask<bit, mask> (*in++) << inwordpointer;
    //    inwordpointer += bit;
    //}
    // attempt (grungy!)

    // loop cannot iterate much
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out |= __bitmask<bit, mask>(*in++) << inwordpointer;
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out |= __bitmask<bit, mask>(*in) << inwordpointer;
      inwordpointer += bit - 32;
      *(out + 1) = __bitmask<bit, mask>(*in++) >> (bit - inwordpointer);

    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}